

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottie2gif.cpp
# Opt level: O1

bool __thiscall App::jsonFile(App *this)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  string extn;
  long *local_60;
  ulong local_58;
  long local_50 [2];
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,".json","");
  uVar2 = local_58;
  uVar1 = (this->fileName)._M_string_length;
  if (local_58 < uVar1) {
    std::__cxx11::string::substr((ulong)&local_40,(ulong)&this->fileName);
    if (local_38 == local_58) {
      if (local_38 == 0) {
        bVar4 = true;
      }
      else {
        iVar3 = bcmp(local_40,local_60,local_38);
        bVar4 = iVar3 == 0;
      }
      goto LAB_00103e3b;
    }
  }
  bVar4 = false;
LAB_00103e3b:
  if ((uVar2 < uVar1) && (local_40 != local_30)) {
    operator_delete(local_40,local_30[0] + 1);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return bVar4;
}

Assistant:

bool jsonFile() {
        std::string extn = ".json";
        if ( fileName.size() <= extn.size() ||
             fileName.substr(fileName.size()- extn.size()) != extn )
            return false;

        return true;
    }